

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,XmlFormatting fmt)

{
  bool bVar1;
  ulong uVar2;
  XmlWriter *in_RDI;
  bool tagWasOpen;
  XmlEncode *xmlEncode;
  XmlFormatting fmt_00;
  XmlWriter *in_stack_ffffffffffffffa0;
  XmlWriter *this_00;
  XmlEncode *in_stack_ffffffffffffffb0;
  byte local_15;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_15 = in_RDI->m_tagIsOpen & 1;
    ensureTagClosed(in_stack_ffffffffffffffa0);
    if (((local_15 & 1) != 0) && (bVar1 = anon_unknown_1::shouldIndent(None), bVar1)) {
      std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
    }
    xmlEncode = (XmlEncode *)in_RDI->m_os;
    this_00 = (XmlWriter *)&stack0xffffffffffffffc0;
    XmlEncode::XmlEncode
              (in_stack_ffffffffffffffb0,(string *)in_RDI,(ForWhat)((ulong)this_00 >> 0x20));
    Catch::operator<<((ostream *)this_00,xmlEncode);
    fmt_00 = (XmlFormatting)((ulong)xmlEncode >> 0x20);
    XmlEncode::~XmlEncode((XmlEncode *)0x13a195);
    applyFormatting(this_00,fmt_00);
  }
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, XmlFormatting fmt) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if (tagWasOpen && shouldIndent(fmt)) {
                m_os << m_indent;
            }
            m_os << XmlEncode( text );
            applyFormatting(fmt);
        }
        return *this;
    }